

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  string *local_4e8;
  bad_alloc *anon_var_0;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  _union_1457 _Stack_2d8;
  sigaction sa;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [35];
  byte local_fd;
  int local_fc;
  string local_f8 [3];
  bool skipheader;
  int opt;
  string subfolder;
  allocator local_d5 [20];
  allocator local_c1;
  string *local_c0;
  string local_b8 [32];
  string local_98 [32];
  string asStack_78 [7];
  undefined1 local_71;
  bool abStack_70 [7];
  bool ordFlag;
  bool outputFlags [8];
  FILE *fout [8];
  bool local_19;
  bool useReturnPeriodFile;
  char **argv_local;
  int argc_local;
  
  local_19 = false;
  outputFlags[0] = false;
  outputFlags[1] = false;
  outputFlags[2] = false;
  outputFlags[3] = false;
  outputFlags[4] = false;
  outputFlags[5] = false;
  outputFlags[6] = false;
  outputFlags[7] = false;
  _abStack_70 = 0;
  local_71 = 0;
  local_c0 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_c1);
  local_c0 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",local_d5);
  std::allocator<char>::~allocator((allocator<char> *)local_d5);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::string(local_f8);
  local_fd = 0;
  while (local_fc = getopt(argc,argv,"vhrHF:W:M:S:K:f:w:s:m:"), pcVar1 = _optarg, local_fc != -1) {
    switch(local_fc) {
    case 0x46:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,pcVar1,&local_121);
      openpipe(0,(string *)local_120,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      _abStack_70 = CONCAT71(stack0xffffffffffffff91,1);
      break;
    default:
      help();
      exit(1);
    case 0x48:
      local_fd = 1;
      break;
    case 0x4b:
      std::__cxx11::string::operator=(local_f8,_optarg);
      break;
    case 0x4d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,pcVar1,&local_211);
      openpipe(3,(string *)local_210,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      abStack_70._0_4_ = CONCAT13(1,abStack_70._0_3_);
      break;
    case 0x53:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,pcVar1,&local_1c1);
      openpipe(2,(string *)local_1c0,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      abStack_70._0_3_ = CONCAT12(1,abStack_70._0_2_);
      break;
    case 0x57:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,pcVar1,&local_171);
      openpipe(1,(string *)local_170,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      abStack_70._0_2_ = CONCAT11(1,abStack_70[0]);
      break;
    case 0x66:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,pcVar1,&local_149);
      openpipe(4,(string *)local_148,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      abStack_70._0_5_ = CONCAT14(1,abStack_70._0_4_);
      break;
    case 0x68:
      help();
      exit(1);
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,pcVar1,(allocator *)((long)&sa.sa_restorer + 7));
      openpipe(7,(string *)local_238,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)((long)&sa.sa_restorer + 7));
      _abStack_70 = CONCAT17(1,abStack_70);
      break;
    case 0x72:
      local_19 = true;
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,pcVar1,&local_1e9);
      openpipe(6,(string *)local_1e8,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      abStack_70 = (bool  [7])CONCAT16(1,abStack_70._0_6_);
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    case 0x77:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,pcVar1,&local_199);
      openpipe(5,(string *)local_198,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      abStack_70._0_6_ = CONCAT15(1,abStack_70._0_5_);
    }
  }
  if (argc == 1) {
    fprintf(_stderr,"FATAL: Invalid parameters\n");
    help();
  }
  progname = *argv;
  sa.sa_mask.__val[0xe] = 0;
  sa.sa_mask.__val[0xf] = 0;
  sa.sa_mask.__val[0xc] = 0;
  sa.sa_mask.__val[0xd] = 0;
  sa.sa_mask.__val[10] = 0;
  sa.sa_mask.__val[0xb] = 0;
  sa.sa_mask.__val[8] = 0;
  sa.sa_mask.__val[9] = 0;
  sa.sa_mask.__val[6] = 0;
  sa.sa_mask.__val[7] = 0;
  sa.sa_mask.__val[4] = 0;
  sa.sa_mask.__val[5] = 0;
  sa.sa_mask.__val[2] = 0;
  sa.sa_mask.__val[3] = 0;
  sa.sa_mask.__val[0] = 0;
  sa.sa_mask.__val[1] = 0;
  _Stack_2d8.sa_handler = (__sighandler_t)0x0;
  sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  sa.sa_flags = 0;
  sa._140_4_ = 0;
  sigemptyset((sigset_t *)&sa);
  _Stack_2d8.sa_handler = segfault_sigaction;
  sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
  sigaction(0xb,(sigaction *)&_Stack_2d8,(sigaction *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"",&local_321);
  initstreams((string *)local_2f8,(string *)local_320);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  pcVar1 = progname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,pcVar1,&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"INFO",&local_371);
  logprintf((string *)local_348,(string *)local_370,"starting process..\n");
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  leccalc::doit((string *)local_f8,(FILE **)outputFlags,local_19,(bool)(local_fd & 1),abStack_70,
                false,(string *)local_b8,progname);
  pcVar1 = progname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,pcVar1,&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"INFO",(allocator *)((long)&anon_var_0 + 7));
  logprintf((string *)local_398,(string *)local_3c0,"finishing process..\n");
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  anon_var_0._0_4_ = 1;
  std::__cxx11::string::~string(local_f8);
  local_4e8 = asStack_78;
  do {
    local_4e8 = local_4e8 + -0x20;
    std::__cxx11::string::~string(local_4e8);
  } while (local_4e8 != local_b8);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bool useReturnPeriodFile = false;
	FILE* fout[] = { nullptr,nullptr,nullptr,nullptr,nullptr,nullptr,nullptr,nullptr };
	bool outputFlags[8] = { false, false, false, false,
				false, false, false, false };
	const bool ordFlag = false;   // Turn off ORD output
	const std::string parquetOutFiles[2] = { "", "" };

	std::string subfolder;
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vhrHF:W:M:S:K:f:w:s:m:")) != -1) {
		switch (opt) {
		case 'K':
			subfolder = optarg;
			break;
		case 'H':
			skipheader = true;
			break;
		case 'F':
			openpipe(AGG_FULL_UNCERTAINTY, optarg, fout);
			outputFlags[AGG_FULL_UNCERTAINTY] = true;
			break;
		case 'f':
			openpipe(OCC_FULL_UNCERTAINTY, optarg, fout);
			outputFlags[OCC_FULL_UNCERTAINTY] = true;
			break;
		case 'W':
			openpipe(AGG_WHEATSHEAF, optarg, fout);
			outputFlags[AGG_WHEATSHEAF] = true;
			break;
		case 'w':
			openpipe(OCC_WHEATSHEAF, optarg, fout);
			outputFlags[OCC_WHEATSHEAF] = true;
			break;
		case 'S':
			openpipe(AGG_SAMPLE_MEAN, optarg, fout);
			outputFlags[AGG_SAMPLE_MEAN] = true;
			break;
		case 's':
			openpipe(OCC_SAMPLE_MEAN, optarg, fout);
			outputFlags[OCC_SAMPLE_MEAN] = true;
			break;
		case 'M':
			openpipe(AGG_WHEATSHEAF_MEAN, optarg, fout);
			outputFlags[AGG_WHEATSHEAF_MEAN] = true;
			break;
		case 'm':
			openpipe(OCC_WHEATSHEAF_MEAN, optarg, fout);
			outputFlags[OCC_WHEATSHEAF_MEAN] = true;
			break;
		case 'r':
			useReturnPeriodFile = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			::exit(EXIT_FAILURE);
			break;
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	if (argc == 1) {
		fprintf(stderr, "FATAL: Invalid parameters\n");
		help();
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
        	logprintf(progname, "INFO", "starting process..\n");
		leccalc::doit(subfolder, fout, useReturnPeriodFile, skipheader,
			      outputFlags, ordFlag, parquetOutFiles, progname);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	}catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	
}